

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uchriter.cpp
# Opt level: O1

void __thiscall
icu_63::UCharCharacterIterator::setText
          (UCharCharacterIterator *this,ConstChar16Ptr *newText,int32_t newTextLength)

{
  if (newTextLength < 1) {
    newTextLength = 0;
  }
  if (newText->p_ == (char16_t *)0x0) {
    newTextLength = 0;
  }
  this->text = newText->p_;
  (this->super_CharacterIterator).textLength = newTextLength;
  (this->super_CharacterIterator).end = newTextLength;
  (this->super_CharacterIterator).pos = 0;
  (this->super_CharacterIterator).begin = 0;
  return;
}

Assistant:

void UCharCharacterIterator::setText(ConstChar16Ptr newText,
                                     int32_t      newTextLength) {
    text = newText;
    if(newText == 0 || newTextLength < 0) {
        newTextLength = 0;
    }
    end = textLength = newTextLength;
    pos = begin = 0;
}